

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

void deqp::gles31::bb::anon_unknown_11::unmapBuffers
               (Functions *gl,
               vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               *buffers)

{
  GLenum err;
  pointer pBVar1;
  long lVar2;
  
  pBVar1 = (buffers->
           super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(buffers->
                              super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3)) {
    lVar2 = 0;
    do {
      if (0 < pBVar1[lVar2].size) {
        (*gl->bindBuffer)(0x90d2,pBVar1[lVar2].buffer);
        (*gl->unmapBuffer)(0x90d2);
      }
      lVar2 = lVar2 + 1;
      pBVar1 = (buffers->
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(buffers->
                                         super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1)
                          >> 3));
  }
  err = (*gl->getError)();
  glu::checkError(err,"Failed to unmap buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0x7e9);
  return;
}

Assistant:

void unmapBuffers (const glw::Functions& gl, const vector<Buffer>& buffers)
{
	for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
	{
		if (buffers[ndx].size > 0)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
			gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer");
}